

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O3

rand_gen * init_rand(char *gen_type)

{
  double dVar1;
  char cVar2;
  int iVar3;
  rand_gen *gen;
  param_3 *ppVar4;
  param_2 *param;
  code *pcVar5;
  char type [27];
  char acStack_38 [32];
  
  gen = (rand_gen *)malloc(0x34);
  if (gen == (rand_gen *)0x0) {
    __assert_fail("gen",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                  ,0x150,"struct rand_gen *init_rand(char *)");
  }
  iVar3 = strncmp(gen_type,"fixed",5);
  if (iVar3 == 0) {
    ppVar4 = (param_3 *)parse_param_1(gen_type);
    gen->set_avg = fixed_set_avg;
    gen->inv_cdf = fixed_inv_cdf;
    gen->generate = (_func_double_rand_gen_ptr *)0x0;
    gen->gen_type = 1;
LAB_0010246b:
    dVar1 = ppVar4->a;
LAB_0010246f:
    (gen->params).p1.a = dVar1;
    goto LAB_00102675;
  }
  cVar2 = *gen_type;
  if (cVar2 == 'e') {
    if (gen_type[1] != 'x') goto LAB_001024c1;
    if (gen_type[2] == 'p') {
      ppVar4 = (param_3 *)parse_param_1(gen_type);
      gen->set_avg = exp_set_avg;
      gen->inv_cdf = exp_inv_cdf;
      gen->generate = (_func_double_rand_gen_ptr *)0x0;
      gen->gen_type = 2;
      dVar1 = 1.0 / ppVar4->a;
      goto LAB_0010246f;
    }
    iVar3 = strncmp(gen_type,"pareto",6);
    if (iVar3 != 0) goto LAB_00102515;
LAB_0010263b:
    ppVar4 = parse_param_3(gen_type);
    dVar1 = ppVar4->b;
    (gen->params).p1.a = ppVar4->a;
    (gen->params).p2.b = dVar1;
    (gen->params).p3.c = ppVar4->c;
    gen->set_avg = gpar_set_avg;
    pcVar5 = gpar_inv_cdf;
  }
  else {
    if (cVar2 == 'u') {
      if ((gen_type[1] == 'n') && (gen_type[2] == 'i')) {
        ppVar4 = (param_3 *)parse_param_1(gen_type);
        pcVar5 = uni_generate;
        goto LAB_00102467;
      }
    }
    else if ((cVar2 == 'r') && (gen_type[1] == 'r')) {
      ppVar4 = (param_3 *)parse_param_1(gen_type);
      pcVar5 = rr_generate;
LAB_00102467:
      gen->generate = pcVar5;
      goto LAB_0010246b;
    }
LAB_001024c1:
    iVar3 = strncmp(gen_type,"pareto",6);
    if (iVar3 == 0) goto LAB_0010263b;
    if (((cVar2 == 'g') && (gen_type[1] == 'e')) && (gen_type[2] == 'v')) goto LAB_001025ca;
LAB_00102515:
    iVar3 = strcmp(gen_type,"fb_key");
    if (iVar3 == 0) {
      builtin_strncpy(acStack_38 + 0x10,"449:0.078688",0xd);
      builtin_strncpy(acStack_38,"gev:30.7984:8.20",0x10);
      gen_type = acStack_38;
LAB_001025ca:
      ppVar4 = parse_param_3(gen_type);
      dVar1 = ppVar4->b;
      (gen->params).p1.a = ppVar4->a;
      (gen->params).p2.b = dVar1;
      (gen->params).p3.c = ppVar4->c;
      gen->set_avg = gev_set_avg;
      gen->inv_cdf = gev_inv_cdf;
      gen->generate = (_func_double_rand_gen_ptr *)0x0;
      gen->gen_type = 0;
      return gen;
    }
    iVar3 = strcmp(gen_type,"fb_ia");
    if (iVar3 == 0) {
      builtin_strncpy(acStack_38,"gpar:0:16.0292:0.154971",0x18);
      gen_type = acStack_38;
      goto LAB_0010263b;
    }
    iVar3 = strcmp(gen_type,"fb_val");
    if (iVar3 == 0) {
      builtin_strncpy(acStack_38 + 0x10,"6:0.348238",0xb);
      builtin_strncpy(acStack_38,"gpar:15.0:214.47",0x10);
      gen_type = acStack_38;
      goto LAB_0010263b;
    }
    iVar3 = strncmp(gen_type,"bimodal",7);
    if (iVar3 != 0) {
      iVar3 = strncmp(gen_type,"lognorm",7);
      if (iVar3 == 0) {
        param = parse_param_2(gen_type);
        lognormal_init(gen,param);
        return gen;
      }
      iVar3 = strncmp(gen_type,"gamma",5);
      if (iVar3 != 0) {
        init_rand_cold_1();
        return (rand_gen *)0x0;
      }
      parse_param_2(gen_type);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                    ,0x10f,"void gamma_init(struct rand_gen *, struct param_2 *)");
    }
    ppVar4 = parse_param_3(gen_type);
    dVar1 = ppVar4->b;
    (gen->params).p1.a = ppVar4->a;
    (gen->params).p2.b = dVar1;
    (gen->params).p3.c = ppVar4->c;
    gen->set_avg = bimodal_set_avg;
    pcVar5 = bimodal_inv_cdf;
  }
  gen->inv_cdf = pcVar5;
  gen->generate = (_func_double_rand_gen_ptr *)0x0;
  gen->gen_type = 0;
LAB_00102675:
  free(ppVar4);
  return gen;
}

Assistant:

struct rand_gen *init_rand(char *gen_type)
{
	struct rand_gen *gen = (struct rand_gen *)malloc(sizeof(struct rand_gen));
	assert(gen);

	if (strncmp(gen_type, "fixed", 5) == 0)
		fixed_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "rr", 2) == 0)
		rr_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "uni", 3) == 0)
		uni_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "exp", 3) == 0)
		exp_init(gen, parse_param_1(gen_type));
	else if (strncmp(gen_type, "pareto", 6) == 0)
		gpar_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "gev", 3) == 0)
		gev_init(gen, parse_param_3(gen_type));
	else if (strcmp(gen_type, "fb_key") == 0) {
		char type[] = "gev:30.7984:8.20449:0.078688";
		gev_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_ia") == 0) {
		char type[] = "gpar:0:16.0292:0.154971";
		gpar_init(gen, parse_param_3(type));
	} else if (strcmp(gen_type, "fb_val") == 0) {
		/* WARNING: this is not exactly the same as mutilate */
		char type[] = "gpar:15.0:214.476:0.348238";
		gpar_init(gen, parse_param_3(type));
	} else if (strncmp(gen_type, "bimodal", 7) == 0)
		bimodal_init(gen, parse_param_3(gen_type));
	else if (strncmp(gen_type, "lognorm", 7) == 0)
		lognormal_init(gen, parse_param_2(gen_type));
	else if (strncmp(gen_type, "gamma", 5) == 0)
		gamma_init(gen, parse_param_2(gen_type));
	else {
		lancet_fprintf(stderr, "Unknown generator type %s\n", gen_type);
		return NULL;
	}
	return gen;
}